

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O2

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::ConcatenationExpression>
          (SampledValueFuncVisitor *this,ConcatenationExpression *expr)

{
  size_t sVar1;
  bool bVar2;
  KnownSystemName KVar3;
  Expression *pEVar4;
  Diagnostic *this_00;
  string_view arg;
  
  bVar2 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (!bVar2) {
    ast::ConcatenationExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>(expr,this);
    return;
  }
  KVar3 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  sVar1 = expr[1].operands_._M_extent._M_extent_value;
  if (KVar3 == Past) {
    if (sVar1 != 4) goto LAB_0032a7c0;
    pEVar4 = expr[1].operands_._M_ptr[3];
  }
  else {
    if (sVar1 != 2) goto LAB_0032a7c0;
    pEVar4 = expr[1].operands_._M_ptr[1];
  }
  if (pEVar4->kind != EmptyArgument) {
    return;
  }
LAB_0032a7c0:
  this_00 = AnalysisContext::addDiag
                      (this->context,this->parentSymbol,(DiagCode)0x8000e,
                       (expr->super_Expression).sourceRange);
  arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }